

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 subFloat128Sigs(float128 a,float128 b,flag zSign,float_status *status)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint64_t zSig0;
  uint uVar11;
  ulong uVar12;
  uint64_t zSig1;
  bool bVar13;
  float128 fVar14;
  
  uVar11 = a.high._6_2_ & 0x7fff;
  uVar7 = b.high._6_2_ & 0x7fff;
  uVar12 = a.low * 0x4000;
  uVar10 = a.low >> 0x32 | (a.high & 0xffffffffffff) << 0xe;
  uVar2 = b.low * 0x4000;
  uVar4 = b.low >> 0x32 | (b.high & 0xffffffffffff) << 0xe;
  uVar9 = uVar11 - uVar7;
  if (uVar9 == 0 || uVar11 < uVar7) {
    uVar5 = uVar10;
    if ((int)uVar9 < 0) {
      if (uVar7 == 0x7fff) {
        if (uVar4 != 0 || uVar2 != 0) goto LAB_00cfab07;
        uVar2 = (ulong)(byte)~zSign << 0x3f | 0x7fff000000000000;
LAB_00cfac2c:
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar2;
        return (float128)(auVar1 << 0x40);
      }
      bVar13 = ((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0
      ;
      uVar5 = uVar10 | 0x4000000000000000;
      if (bVar13) {
        uVar5 = uVar10;
      }
      iVar8 = -(uint)bVar13;
      uVar11 = iVar8 - uVar9;
      if (uVar11 != 0) {
        bVar3 = -((char)iVar8 - (char)uVar9) & 0x3f;
        bVar6 = (byte)uVar11;
        if (uVar11 < 0x40) {
          uVar12 = (ulong)(uVar12 << bVar3 != 0) | uVar12 >> (bVar6 & 0x3f) | uVar5 << bVar3;
          uVar5 = uVar5 >> (bVar6 & 0x3f);
        }
        else if (uVar11 == 0x40) {
          uVar12 = uVar5 | uVar12 != 0;
          uVar5 = 0;
        }
        else {
          if (uVar11 < 0x80) {
            uVar12 = (ulong)(uVar5 << bVar3 != 0 || uVar12 != 0) | uVar5 >> (bVar6 & 0x3f);
          }
          else {
            uVar12 = (ulong)(uVar5 != 0 || uVar12 != 0);
          }
          uVar5 = 0;
        }
      }
      uVar4 = uVar4 | 0x4000000000000000;
    }
    else {
      if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
        uVar11 = 1;
        uVar7 = 1;
      }
      else if (uVar11 == 0x7fff) {
        if (((uVar10 == 0 && uVar12 == 0) && uVar2 == 0) && uVar4 == 0) {
          status->float_exception_flags = status->float_exception_flags | 1;
          uVar2 = 0x7fff800000000000;
          goto LAB_00cfac2c;
        }
        goto LAB_00cfab07;
      }
      if (uVar4 < uVar10) goto LAB_00cfacc8;
      if (uVar4 <= uVar10) {
        if (uVar2 < uVar12) goto LAB_00cfacc8;
        if (uVar2 <= uVar12) {
          uVar2 = (ulong)(status->float_rounding_mode == '\x01') << 0x3f;
          goto LAB_00cfac2c;
        }
      }
    }
    zSig1 = uVar2 - uVar12;
    zSig0 = (uVar4 - uVar5) - (ulong)(uVar2 < uVar12);
    zSign = zSign ^ 1;
  }
  else {
    if (uVar11 == 0x7fff) {
      if (uVar10 == 0 && uVar12 == 0) {
        return a;
      }
LAB_00cfab07:
      fVar14 = propagateFloat128NaN(a,b,status);
      return fVar14;
    }
    if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      uVar9 = uVar9 - 1;
      if (uVar9 != 0) goto LAB_00cfab91;
    }
    else {
      uVar4 = uVar4 | 0x4000000000000000;
LAB_00cfab91:
      bVar6 = (byte)uVar9;
      bVar3 = -bVar6 & 0x3f;
      if (uVar9 < 0x40) {
        uVar2 = (ulong)(uVar2 << bVar3 != 0) | uVar2 >> (bVar6 & 0x3f) | uVar4 << bVar3;
        uVar4 = uVar4 >> (bVar6 & 0x3f);
      }
      else if (uVar9 == 0x40) {
        uVar2 = uVar4 | uVar2 != 0;
        uVar4 = 0;
      }
      else {
        if (uVar9 < 0x80) {
          uVar2 = (ulong)(uVar4 << bVar3 != 0 || uVar2 != 0) | uVar4 >> (bVar6 & 0x3f);
        }
        else {
          uVar2 = (ulong)(uVar4 != 0 || uVar2 != 0);
        }
        uVar4 = 0;
      }
    }
    uVar10 = uVar10 | 0x4000000000000000;
LAB_00cfacc8:
    zSig1 = uVar12 - uVar2;
    zSig0 = (uVar10 - uVar4) - (ulong)(uVar12 < uVar2);
    uVar7 = uVar11;
  }
  fVar14 = normalizeRoundAndPackFloat128(zSign,uVar7 - 0xf,zSig0,zSig1,status);
  return fVar14;
}

Assistant:

static float128 subFloat128Sigs(float128 a, float128 b, flag zSign,
                                float_status *status)
{
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1;
    int32_t expDiff;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    expDiff = aExp - bExp;
    shortShift128Left( aSig0, aSig1, 14, &aSig0, &aSig1 );
    shortShift128Left( bSig0, bSig1, 14, &bSig0, &bSig1 );
    if ( 0 < expDiff ) goto aExpBigger;
    if ( expDiff < 0 ) goto bExpBigger;
    if ( aExp == 0x7FFF ) {
        if ( aSig0 | aSig1 | bSig0 | bSig1 ) {
            return propagateFloat128NaN(a, b, status);
        }
        float_raise(float_flag_invalid, status);
        return float128_default_nan(status);
    }
    if ( aExp == 0 ) {
        aExp = 1;
        bExp = 1;
    }
    if ( bSig0 < aSig0 ) goto aBigger;
    if ( aSig0 < bSig0 ) goto bBigger;
    if ( bSig1 < aSig1 ) goto aBigger;
    if ( aSig1 < bSig1 ) goto bBigger;
    return packFloat128(status->float_rounding_mode == float_round_down,
                        0, 0, 0);
 bExpBigger:
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return packFloat128( zSign ^ 1, 0x7FFF, 0, 0 );
    }
    if ( aExp == 0 ) {
        ++expDiff;
    }
    else {
        aSig0 |= UINT64_C(0x4000000000000000);
    }
    shift128RightJamming( aSig0, aSig1, - expDiff, &aSig0, &aSig1 );
    bSig0 |= UINT64_C(0x4000000000000000);
 bBigger:
    sub128( bSig0, bSig1, aSig0, aSig1, &zSig0, &zSig1 );
    zExp = bExp;
    zSign ^= 1;
    goto normalizeRoundAndPack;
 aExpBigger:
    if ( aExp == 0x7FFF ) {
        if (aSig0 | aSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        --expDiff;
    }
    else {
        bSig0 |= UINT64_C(0x4000000000000000);
    }
    shift128RightJamming( bSig0, bSig1, expDiff, &bSig0, &bSig1 );
    aSig0 |= UINT64_C(0x4000000000000000);
 aBigger:
    sub128( aSig0, aSig1, bSig0, bSig1, &zSig0, &zSig1 );
    zExp = aExp;
 normalizeRoundAndPack:
    --zExp;
    return normalizeRoundAndPackFloat128(zSign, zExp - 14, zSig0, zSig1,
                                         status);

}